

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(void)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  size_t __size;
  long lVar4;
  timespec start;
  timespec end;
  timespec local_40;
  timespec local_30;
  
  clock_gettime(1,&local_40);
  iVar3 = 0;
  do {
    lVar4 = 0;
    do {
      if (p != (void *)0x0) {
        free(p);
      }
      p = malloc((long)*(int *)((long)sizes + lVar4));
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x24);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100000);
  clock_gettime(1,&local_30);
  iVar3 = 0;
  printf("%s, free+malloc:\n\t %lld\n","main",
         ((local_30.tv_sec - local_40.tv_sec) * 1000000000 + local_30.tv_nsec) - local_40.tv_nsec);
  clock_gettime(1,&local_40);
  do {
    lVar4 = 0;
    do {
      p = realloc(p,(long)*(int *)((long)sizes + lVar4));
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x24);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100000);
  clock_gettime(1,&local_30);
  iVar3 = 0;
  printf("%s, realloc:\n\t %lld\n","main",
         ((local_30.tv_sec - local_40.tv_sec) * 1000000000 + local_30.tv_nsec) - local_40.tv_nsec);
  putchar(10);
  clock_gettime(1,&local_40);
  do {
    lVar4 = 0;
    do {
      if (p != (void *)0x0) {
        free(p);
      }
      p = malloc((long)*(int *)((long)sizes + lVar4) << 0xe);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x24);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100000);
  clock_gettime(1,&local_30);
  iVar3 = 0;
  printf("%s, free+malloc:\n\t %lld\n","main",
         ((local_30.tv_sec - local_40.tv_sec) * 1000000000 + local_30.tv_nsec) - local_40.tv_nsec);
  clock_gettime(1,&local_40);
  do {
    lVar4 = 0;
    do {
      p = realloc(p,(long)*(int *)((long)sizes + lVar4) << 0xe);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x24);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100000);
  clock_gettime(1,&local_30);
  iVar3 = 0;
  printf("%s, realloc:\n\t %lld\n","main",
         ((local_30.tv_sec - local_40.tv_sec) * 1000000000 + local_30.tv_nsec) - local_40.tv_nsec);
  putchar(10);
  clock_gettime(1,&local_40);
  do {
    lVar4 = 0;
    do {
      iVar1 = *(int *)((long)sizes + lVar4);
      p = realloc(p,(long)iVar1 << 0x14);
      p = realloc(p,(long)iVar1);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x24);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100000);
  clock_gettime(1,&local_30);
  iVar3 = 0;
  printf("%s, realloc*2:\n\t %lld\n","main",
         ((local_30.tv_sec - local_40.tv_sec) * 1000000000 + local_30.tv_nsec) - local_40.tv_nsec);
  clock_gettime(1,&local_40);
  do {
    lVar4 = 0;
    do {
      if (p != (void *)0x0) {
        free(p);
      }
      iVar1 = *(int *)((long)sizes + lVar4);
      p = malloc((long)iVar1 << 0x14);
      if (p != (void *)0x0) {
        free(p);
      }
      p = malloc((long)iVar1);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x24);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100000);
  clock_gettime(1,&local_30);
  iVar3 = 0;
  printf("%s, free+malloc*2:\n\t %lld\n","main",
         ((local_30.tv_sec - local_40.tv_sec) * 1000000000 + local_30.tv_nsec) - local_40.tv_nsec);
  putchar(10);
  clock_gettime(1,&local_40);
  do {
    lVar4 = 0;
    do {
      iVar1 = *(int *)((long)sizes + lVar4);
      p = realloc(p,(long)iVar1 << 0x14);
      p = realloc(p,(long)iVar1 << 10);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x24);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100000);
  clock_gettime(1,&local_30);
  iVar3 = 0;
  printf("%s, realloc*2:\n\t %lld\n","main",
         ((local_30.tv_sec - local_40.tv_sec) * 1000000000 + local_30.tv_nsec) - local_40.tv_nsec);
  clock_gettime(1,&local_40);
  do {
    lVar4 = 0;
    do {
      if (p != (void *)0x0) {
        free(p);
      }
      iVar1 = *(int *)((long)sizes + lVar4);
      p = malloc((long)iVar1 << 0x14);
      if (p != (void *)0x0) {
        free(p);
      }
      p = malloc((long)iVar1 << 10);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x24);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100000);
  clock_gettime(1,&local_30);
  iVar3 = 0;
  printf("%s, free+malloc*2:\n\t %lld\n","main",
         ((local_30.tv_sec - local_40.tv_sec) * 1000000000 + local_30.tv_nsec) - local_40.tv_nsec);
  putchar(10);
  clock_gettime(1,&local_40);
  do {
    lVar4 = 0;
    do {
      p = realloc(p,(long)*(int *)((long)sizes + lVar4) << 0x14);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x24);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100000);
  clock_gettime(1,&local_30);
  iVar3 = 0;
  printf("%s, realloc:\n\t %lld\n","main",
         ((local_30.tv_sec - local_40.tv_sec) * 1000000000 + local_30.tv_nsec) - local_40.tv_nsec);
  clock_gettime(1,&local_40);
  do {
    lVar4 = 0;
    do {
      if (p != (void *)0x0) {
        free(p);
      }
      p = malloc((long)*(int *)((long)sizes + lVar4) << 0x14);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x24);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100000);
  clock_gettime(1,&local_30);
  lVar4 = 0;
  printf("%s, free+malloc:\n\t %lld\n","main",
         ((local_30.tv_sec - local_40.tv_sec) * 1000000000 + local_30.tv_nsec) - local_40.tv_nsec);
  putchar(10);
  clock_gettime(1,&local_40);
  do {
    pvVar2 = malloc(0x2000);
    *(void **)((long)pages + lVar4) = pvVar2;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20000);
  clock_gettime(1,&local_30);
  lVar4 = 0;
  printf("%s, pages:\n\t %lld\n","main",
         ((local_30.tv_sec - local_40.tv_sec) * 1000000000 + local_30.tv_nsec) - local_40.tv_nsec);
  do {
    free(*(void **)((long)pages + lVar4));
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x20000);
  clock_gettime(1,&local_40);
  p = realloc(p,0x5554000);
  __size = 0x5556000;
  do {
    p = realloc(p,__size);
    __size = __size + 0x2000;
  } while (__size != 0x8002000);
  clock_gettime(1,&local_30);
  printf("%s, realloc:\n\t %lld\n","main",
         ((local_30.tv_sec - local_40.tv_sec) * 1000000000 + local_30.tv_nsec) - local_40.tv_nsec);
  free(p);
  clock_gettime(1,&local_40);
  p = malloc(0x18000000);
  p = realloc(p,0x8000000);
  clock_gettime(1,&local_30);
  printf("%s, shrink:\n\t %lld\n","main",
         ((local_30.tv_sec - local_40.tv_sec) * 1000000000 + local_30.tv_nsec) - local_40.tv_nsec);
  free(p);
  return 0;
}

Assistant:

int
main()
{
    unsigned int i, j;
    struct timespec start, end;
    long long t;
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j]);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j]);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j] * 16 * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j] * 16 * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j] * 1024 * 1024);
            p = realloc(p, sizes[j]);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc*2:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j] * 1024 * 1024);
            if (p)
                free(p);
            p = malloc(sizes[j]);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc*2:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j] * 1024 * 1024);
            p = realloc(p, sizes[j] * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc*2:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j] * 1024 * 1024);
            if (p)
                free(p);
            p = malloc(sizes[j] * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc*2:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            p = realloc(p, sizes[j] * 1024 * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc:\n\t %lld\n", __func__, t);
    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < N;i++) {
        for (j = 0;j < sizeof(sizes) / sizeof(int);j++) {
            if (p)
                free(p);
            p = malloc(sizes[j] * 1024 * 1024);
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, free+malloc:\n\t %lld\n", __func__, t);
    printf("\n");

    clock_gettime(CLOCK_ID, &start);
    for (i = 0;i < PAGE_COUNT;i++) {
        pages[i] = malloc(PAGE_SIZE);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, pages:\n\t %lld\n", __func__, t);
    for (i = 0;i < PAGE_COUNT;i++) {
        free(pages[i]);
    }

    clock_gettime(CLOCK_ID, &start);
    p = realloc(p, PAGE_INIT * PAGE_SIZE);
    for (i = PAGE_INIT + 1;i <= PAGE_COUNT;i++) {
        p = realloc(p, PAGE_SIZE * i);
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, realloc:\n\t %lld\n", __func__, t);
    free(p);

    clock_gettime(CLOCK_ID, &start);
    p = malloc(PAGE_COUNT * PAGE_SIZE * 3);
    p = realloc(p, PAGE_COUNT * PAGE_SIZE);
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, shrink:\n\t %lld\n", __func__, t);

    free(p);
    return 0;
}